

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_types.h
# Opt level: O0

bool __thiscall
jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::operator==
          (SamplingStrategyResponse *this,SamplingStrategyResponse *rhs)

{
  bool bVar1;
  SamplingStrategyResponse *rhs_local;
  SamplingStrategyResponse *this_local;
  
  if (*(int *)(this + 8) == *(int *)(rhs + 8)) {
    if (((byte)this[0x70] & 1) == ((byte)rhs[0x70] & 1)) {
      if ((((byte)this[0x70] & 1) != 0) &&
         (bVar1 = ProbabilisticSamplingStrategy::operator==
                            ((ProbabilisticSamplingStrategy *)(this + 0x10),
                             (ProbabilisticSamplingStrategy *)(rhs + 0x10)), !bVar1)) {
        return false;
      }
      if (((byte)this[0x70] >> 1 & 1) == ((byte)rhs[0x70] >> 1 & 1)) {
        if ((((byte)this[0x70] >> 1 & 1) != 0) &&
           (bVar1 = RateLimitingSamplingStrategy::operator==
                              ((RateLimitingSamplingStrategy *)(this + 0x20),
                               (RateLimitingSamplingStrategy *)(rhs + 0x20)), !bVar1)) {
          return false;
        }
        if (((byte)this[0x70] >> 2 & 1) == ((byte)rhs[0x70] >> 2 & 1)) {
          if ((((byte)this[0x70] >> 2 & 1) != 0) &&
             (bVar1 = PerOperationSamplingStrategies::operator==
                                ((PerOperationSamplingStrategies *)(this + 0x30),
                                 (PerOperationSamplingStrategies *)(rhs + 0x30)), !bVar1)) {
            return false;
          }
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool operator == (const SamplingStrategyResponse & rhs) const
  {
    if (!(strategyType == rhs.strategyType))
      return false;
    if (__isset.probabilisticSampling != rhs.__isset.probabilisticSampling)
      return false;
    else if (__isset.probabilisticSampling && !(probabilisticSampling == rhs.probabilisticSampling))
      return false;
    if (__isset.rateLimitingSampling != rhs.__isset.rateLimitingSampling)
      return false;
    else if (__isset.rateLimitingSampling && !(rateLimitingSampling == rhs.rateLimitingSampling))
      return false;
    if (__isset.operationSampling != rhs.__isset.operationSampling)
      return false;
    else if (__isset.operationSampling && !(operationSampling == rhs.operationSampling))
      return false;
    return true;
  }